

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O0

kp_error_t kp_agent_send(kp_agent *agent,kp_agent_msg_type type,void *data,size_t size)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  u_int16_t unaff_retaddr;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  uVar1 = (uint)in_RCX & 0xffff;
  iVar2 = imsg_compose((imsgbuf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       (u_int32_t)((ulong)in_RDX >> 0x20),(u_int32_t)in_RDX,
                       (pid_t)((ulong)in_RCX >> 0x20),(uint)in_RCX,in_stack_ffffffffffffffd0,
                       unaff_retaddr);
  if (iVar2 < 0) {
    local_4 = 5;
  }
  else {
    iVar2 = imsg_flush((imsgbuf *)CONCAT44(in_stack_ffffffffffffffcc,uVar1));
    if (iVar2 < 0) {
      local_4 = 5;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

kp_error_t
kp_agent_send(struct kp_agent *agent, enum kp_agent_msg_type type, void *data,
              size_t size)
{
	assert(agent);

	if (imsg_compose(&agent->ibuf, type, 1, 0, -1, data, size) < 0) {
		return KP_ERRNO;
	}
	if (imsg_flush(&agent->ibuf) < 0) {
		return KP_ERRNO;
	}

	return KP_SUCCESS;
}